

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *kernel)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  long start;
  long end;
  Index index;
  long lVar4;
  
  end = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols *
        (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows;
  start = (end / 4) * 4;
  for (lVar4 = 0; lVar4 < start; lVar4 = lVar4 + 4) {
    pfVar1 = (kernel->m_src->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>).m_d
             .data + lVar4;
    uVar3 = *(undefined8 *)(pfVar1 + 2);
    pfVar2 = (kernel->m_dst->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>).m_d
             .data + lVar4;
    *(undefined8 *)pfVar2 = *(undefined8 *)pfVar1;
    *(undefined8 *)(pfVar2 + 2) = uVar3;
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::internal::evaluator<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<float,float>,0>>
            (kernel,start,end);
  return;
}

Assistant:

Index size() const EIGEN_NOEXCEPT { return m_dstExpr.size(); }